

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int pagerBeginReadTransaction(Pager *pPager)

{
  int local_18;
  int local_14;
  int changed;
  int rc;
  Pager *pPager_local;
  
  local_18 = 0;
  _changed = pPager;
  sqlite3WalEndReadTransaction(pPager->pWal);
  local_14 = sqlite3WalBeginReadTransaction(_changed->pWal,&local_18);
  if (((local_14 != 0) || (local_18 != 0)) && (pager_reset(_changed), _changed->bUseFetch != '\0'))
  {
    sqlite3OsUnfetch(_changed->fd,0,(void *)0x0);
  }
  return local_14;
}

Assistant:

static int pagerBeginReadTransaction(Pager *pPager){
  int rc;                         /* Return code */
  int changed = 0;                /* True if cache must be reset */

  assert( pagerUseWal(pPager) );
  assert( pPager->eState==PAGER_OPEN || pPager->eState==PAGER_READER );

  /* sqlite3WalEndReadTransaction() was not called for the previous
  ** transaction in locking_mode=EXCLUSIVE.  So call it now.  If we
  ** are in locking_mode=NORMAL and EndRead() was previously called,
  ** the duplicate call is harmless.
  */
  sqlite3WalEndReadTransaction(pPager->pWal);

  rc = sqlite3WalBeginReadTransaction(pPager->pWal, &changed);
  if( rc!=SQLITE_OK || changed ){
    pager_reset(pPager);
    if( USEFETCH(pPager) ) sqlite3OsUnfetch(pPager->fd, 0, 0);
  }

  return rc;
}